

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  Node *this_00;
  char *pcVar4;
  bool bVar5;
  int32_t iVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  Descriptor *this_01;
  reference ppVar10;
  FieldDescriptor *field;
  Node *node_00;
  MergeOptions *options_00;
  LogMessage *pLVar11;
  Message *pMVar12;
  Message *pMVar13;
  uint64_t uVar14;
  EnumValueDescriptor *pEVar15;
  int64_t iVar16;
  Nonnull<const_char_*> pcVar17;
  undefined8 extraout_RAX;
  byte bVar18;
  Reflection *this_02;
  Reflection *this_03;
  int iVar19;
  uint uVar20;
  float fVar21;
  double dVar22;
  Metadata MVar23;
  const_iterator cVar24;
  const_iterator other;
  string_view name;
  const_iterator other_00;
  string_view str;
  string_view v;
  string_view str_00;
  string_view v_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view v_01;
  string_view str_04;
  string_view v_02;
  LogMessage local_98;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *local_88;
  string local_80;
  string local_60;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
  local_40;
  
  if ((this->root_).children.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    MVar23 = Message::GetMetadata((Message *)node);
    this_02 = MVar23.reflection;
    MVar23 = Message::GetMetadata((Message *)options);
    this_03 = MVar23.reflection;
    MVar23 = Message::GetMetadata((Message *)node);
    this_01 = MVar23.descriptor;
    cVar24 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                      *)this);
    local_40.node_ = cVar24.node_;
    local_40.position_ = cVar24.position_;
    other = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
            ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                   *)this);
    local_88 = other.node_;
    other_00.position_ = other.position_;
    bVar5 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
            ::Equals(&local_40,other);
    do {
      if (bVar5) {
        return;
      }
      ppVar10 = absl::lts_20250127::container_internal::
                btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                ::operator*(&local_40);
      pcVar2 = (ppVar10->first)._M_dataplus._M_p;
      sVar3 = (ppVar10->first)._M_string_length;
      this_00 = (ppVar10->second)._M_t.
                super___uniq_ptr_impl<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
                .
                super__Head_base<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_false>
                ._M_head_impl;
      name._M_str = pcVar2;
      name._M_len = sVar3;
      field = Descriptor::FindFieldByName(this_01,name);
      if (field == (FieldDescriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                   ,0x1b7);
        str_03._M_str = "Cannot find field \"";
        str_03._M_len = 0x13;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_98,str_03);
        v_01._M_str = pcVar2;
        v_01._M_len = sVar3;
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_98,v_01);
        str_04._M_str = "\" in message ";
        str_04._M_len = 0xd;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar11,str_04);
        pcVar4 = (this_01->all_names_).payload_;
        v_02._M_len = (ulong)*(ushort *)(pcVar4 + 2);
        v_02._M_str = pcVar4 + ~v_02._M_len;
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v_02);
LAB_0100b6e9:
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_98);
      }
      else {
        bVar1 = field->field_0x1;
        bVar5 = (bool)((bVar1 & 0x20) >> 5);
        bVar18 = 0xbf < bVar1 ^ bVar5;
        if (*(size_type *)((long)&((Node *)&this_00->children)->children + 0x10) == 0) {
          if (bVar18 == 0) {
            pcVar17 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar17 != (Nonnull<const_char_*>)0x0) goto LAB_0100bdd3;
          if ((field->field_0x1 & 0x20) == 0) {
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
            case 1:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (bVar5) {
                iVar6 = Reflection::GetInt32(this_02,(Message *)node,field);
                Reflection::SetInt32(this_03,(Message *)options,field,iVar6);
              }
              else {
LAB_0100bcd4:
                Reflection::ClearField(this_03,(Message *)options,field);
              }
              break;
            case 2:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              iVar16 = Reflection::GetInt64(this_02,(Message *)node,field);
              Reflection::SetInt64(this_03,(Message *)options,field,iVar16);
              break;
            case 3:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              uVar8 = Reflection::GetUInt32(this_02,(Message *)node,field);
              Reflection::SetUInt32(this_03,(Message *)options,field,uVar8);
              break;
            case 4:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              uVar14 = Reflection::GetUInt64(this_02,(Message *)node,field);
              Reflection::SetUInt64(this_03,(Message *)options,field,uVar14);
              break;
            case 5:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              dVar22 = Reflection::GetDouble(this_02,(Message *)node,field);
              Reflection::SetDouble(this_03,(Message *)options,field,dVar22);
              break;
            case 6:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              fVar21 = Reflection::GetFloat(this_02,(Message *)node,field);
              Reflection::SetFloat(this_03,(Message *)options,field,fVar21);
              break;
            case 7:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              bVar5 = Reflection::GetBool(this_02,(Message *)node,field);
              Reflection::SetBool(this_03,(Message *)options,field,bVar5);
              break;
            case 8:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              pEVar15 = Reflection::GetEnum(this_02,(Message *)node,field);
              Reflection::SetEnum(this_03,(Message *)options,field,pEVar15);
              break;
            case 9:
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar5) goto LAB_0100bcd4;
              Reflection::GetString_abi_cxx11_(&local_60,this_02,(Message *)node,field);
              Reflection::SetString(this_03,(Message *)options,field,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            case 10:
              if (*(char *)&(source->super_MessageLite)._vptr_MessageLite == '\x01') {
                Reflection::ClearField(this_03,(Message *)options,field);
              }
              bVar5 = Reflection::HasField(this_02,(Message *)node,field);
              if (bVar5) {
                pMVar12 = Reflection::MutableMessage
                                    (this_03,(Message *)options,field,(MessageFactory *)0x0);
                pMVar13 = Reflection::GetMessage
                                    (this_02,(Message *)node,field,(MessageFactory *)0x0);
                Message::MergeFrom(pMVar12,pMVar13);
              }
            }
          }
          else {
            if (*(char *)((long)&(source->super_MessageLite)._vptr_MessageLite + 1) == '\x01') {
              Reflection::ClearField(this_03,(Message *)options,field);
            }
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
            case 1:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  iVar6 = Reflection::GetRepeatedInt32(this_02,(Message *)node,field,iVar19);
                  Reflection::AddInt32(this_03,(Message *)options,field,iVar6);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 2:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  iVar16 = Reflection::GetRepeatedInt64(this_02,(Message *)node,field,iVar19);
                  Reflection::AddInt64(this_03,(Message *)options,field,iVar16);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 3:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  uVar8 = Reflection::GetRepeatedUInt32(this_02,(Message *)node,field,iVar19);
                  Reflection::AddUInt32(this_03,(Message *)options,field,uVar8);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 4:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  uVar14 = Reflection::GetRepeatedUInt64(this_02,(Message *)node,field,iVar19);
                  Reflection::AddUInt64(this_03,(Message *)options,field,uVar14);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 5:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  dVar22 = Reflection::GetRepeatedDouble(this_02,(Message *)node,field,iVar19);
                  Reflection::AddDouble(this_03,(Message *)options,field,dVar22);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 6:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  fVar21 = Reflection::GetRepeatedFloat(this_02,(Message *)node,field,iVar19);
                  Reflection::AddFloat(this_03,(Message *)options,field,fVar21);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 7:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  bVar5 = Reflection::GetRepeatedBool(this_02,(Message *)node,field,iVar19);
                  Reflection::AddBool(this_03,(Message *)options,field,bVar5);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 8:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  pEVar15 = Reflection::GetRepeatedEnum(this_02,(Message *)node,field,iVar19);
                  Reflection::AddEnum(this_03,(Message *)options,field,pEVar15);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
              break;
            case 9:
              uVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < (int)uVar9) {
                pMVar12 = (Message *)0x0;
                do {
                  destination = pMVar12;
                  iVar7 = (int)destination;
                  Reflection::GetRepeatedString_abi_cxx11_
                            (&local_80,this_02,(Message *)node,field,iVar7);
                  Reflection::AddString(this_03,(Message *)options,field,&local_80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != &local_80.field_2) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                  uVar20 = iVar7 + 1;
                  pMVar12 = (Message *)(ulong)uVar20;
                } while (uVar9 != uVar20);
              }
              break;
            case 10:
              iVar7 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar7) {
                iVar19 = 0;
                do {
                  pMVar12 = Reflection::AddMessage
                                      (this_03,(Message *)options,field,(MessageFactory *)0x0);
                  pMVar13 = Reflection::GetRepeatedMessage(this_02,(Message *)node,field,iVar19);
                  Message::MergeFrom(pMVar12,pMVar13);
                  iVar19 = iVar19 + 1;
                } while (iVar7 != iVar19);
              }
            }
          }
        }
        else {
          if (bVar18 == 0) {
            pcVar17 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar17 != (Nonnull<const_char_*>)0x0) goto LAB_0100bdc6;
          if (((field->field_0x1 & 0x20) != 0) ||
             (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10)) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                       ,0x1bf);
            str._M_str = "Field \"";
            str._M_len = 7;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_98,str);
            v._M_str = pcVar2;
            v._M_len = sVar3;
            pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_98,v);
            str_00._M_str = "\" in message ";
            str_00._M_len = 0xd;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar11,str_00);
            pcVar4 = (this_01->all_names_).payload_;
            v_00._M_len = (ulong)*(ushort *)(pcVar4 + 2);
            v_00._M_str = pcVar4 + ~v_00._M_len;
            pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,v_00);
            str_01._M_str = " is not a singular message field and cannot ";
            str_01._M_len = 0x2c;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar11,str_01);
            str_02._M_str = "have sub-fields.";
            str_02._M_len = 0x10;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar11,str_02);
            goto LAB_0100b6e9;
          }
          node_00 = (Node *)Reflection::GetMessage
                                      (this_02,(Message *)node,field,(MessageFactory *)0x0);
          options_00 = (MergeOptions *)
                       Reflection::MutableMessage
                                 (this_03,(Message *)options,field,(MessageFactory *)0x0);
          MergeMessage((FieldMaskTree *)this_00,node_00,source,options_00,destination);
        }
      }
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
      ::operator++(&local_40);
      other_00.node_ = local_88;
      other_00._12_4_ = 0;
      bVar5 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
              ::Equals(&local_40,other_00);
    } while( true );
  }
  util::_GLOBAL__N_1::FieldMaskTree::MergeMessage((FieldMaskTree *)&local_98);
LAB_0100bdc6:
  util::_GLOBAL__N_1::FieldMaskTree::MergeMessage();
LAB_0100bdd3:
  util::_GLOBAL__N_1::FieldMaskTree::MergeMessage();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  ABSL_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (const auto& kv : node->children) {
    absl::string_view field_name = kv.first;
    const Node* child = kv.second.get();
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      ABSL_LOG(ERROR) << "Cannot find field \"" << field_name
                      << "\" in message " << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        ABSL_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                        << descriptor->full_name()
                        << " is not a singular message field and cannot "
                        << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}